

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_field.cc
# Opt level: O3

void google::protobuf::compiler::javanano::GenerateOneofFieldHashCode
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Printer *printer)

{
  Type field_type;
  JavaType JVar1;
  char *text;
  
  field_type = FieldDescriptor::type(descriptor);
  JVar1 = GetJavaType(field_type);
  text = "result = 31 * result +\n  ($has_oneof_case$ ? this.$oneof_name$_.hashCode() : 0);\n";
  if (JVar1 == JAVATYPE_BYTES) {
    text = 
    "result = 31 * result + ($has_oneof_case$\n   ? java.util.Arrays.hashCode((byte[]) this.$oneof_name$_) : 0);\n"
    ;
  }
  io::Printer::Print(printer,variables,text);
  return;
}

Assistant:

void GenerateOneofFieldHashCode(const FieldDescriptor* descriptor,
                                const map<string, string>& variables,
                                io::Printer* printer) {
  if (GetJavaType(descriptor) == JAVATYPE_BYTES) {
    printer->Print(variables,
      "result = 31 * result + ($has_oneof_case$\n"
      "   ? java.util.Arrays.hashCode((byte[]) this.$oneof_name$_) : 0);\n");
  } else {
    printer->Print(variables,
      "result = 31 * result +\n"
      "  ($has_oneof_case$ ? this.$oneof_name$_.hashCode() : 0);\n");
  }
}